

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPolComponent_VectorImplementation.cpp
# Opt level: O1

void __thiscall
JPolComponent_VectorImplementation::PrivClone
          (JPolComponent_VectorImplementation *this,JPolComponent_VectorImplementation *o)

{
  pointer ppPVar1;
  int iVar2;
  PolicyPureVector *this_00;
  uint extraout_var;
  Index *pIVar3;
  ulong uVar4;
  Interface_ProblemToPolicyDiscretePure *pIVar5;
  pointer ppPVar6;
  
  this->_m_idc = o->_m_idc;
  this->_m_PTPDP = o->_m_PTPDP;
  boost::shared_ptr<const_Interface_ProblemToPolicyDiscretePure>::operator=
            (&this->_m_PTPDPshared,&o->_m_PTPDPshared);
  std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::resize
            (&this->_m_indivPols_PolicyPureVector,
             (long)(o->_m_indivPols_PolicyPureVector).
                   super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(o->_m_indivPols_PolicyPureVector).
                   super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3);
  ppPVar6 = (o->_m_indivPols_PolicyPureVector).
            super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppPVar1 = (o->_m_indivPols_PolicyPureVector).
            super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppPVar6 != ppPVar1) {
    uVar4 = 0;
    do {
      this_00 = (PolicyPureVector *)operator_new(0x50);
      PolicyPureVector::PolicyPureVector(this_00,*ppPVar6);
      (this->_m_indivPols_PolicyPureVector).
      super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] = this_00;
      ppPVar6 = ppPVar6 + 1;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (ppPVar6 != ppPVar1);
  }
  pIVar5 = this->_m_PTPDP;
  if (pIVar5 == (Interface_ProblemToPolicyDiscretePure *)0x0) {
    pIVar5 = (this->_m_PTPDPshared).px;
  }
  iVar2 = (*(pIVar5->super_Interface_ProblemToPolicyDiscrete).
            _vptr_Interface_ProblemToPolicyDiscrete[3])();
  pIVar3 = (Index *)operator_new__(-(ulong)(extraout_var >> 0x1e != 0) |
                                   CONCAT44(extraout_var,iVar2) * 4);
  this->_m_indivActionIndices = pIVar3;
  return;
}

Assistant:

void JPolComponent_VectorImplementation::PrivClone(const JPolComponent_VectorImplementation& o)
{
    _m_idc = o._m_idc;
    _m_PTPDP = o._m_PTPDP;
    _m_PTPDPshared = o._m_PTPDPshared;
    _m_indivPols_PolicyPureVector.resize(
            o._m_indivPols_PolicyPureVector.size() );

    vector<PolicyPureVector*>::const_iterator it = 
    o._m_indivPols_PolicyPureVector.begin();
    vector<PolicyPureVector*>::const_iterator last = 
    o._m_indivPols_PolicyPureVector.end();

    Index i=0;
    while(it != last)
    {
        //make a copy of the individual policy
        PolicyPureVector* ind_pol = new PolicyPureVector(**it);
        //store the reference to the new copy 
        _m_indivPols_PolicyPureVector[i] = (ind_pol);
        it++; 
        i++;
    }
    //allocate a new array for temporarily storing indiv. actions
    _m_indivActionIndices = new Index[ GetInterfacePTPDiscretePure()->GetNrAgents() ];
       
}